

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

int __thiscall diy::FileStorage::put(FileStorage *this,void *x,Save *save)

{
  size_t sz;
  int iVar1;
  string filename;
  FileBuffer fb;
  string local_60;
  BinaryBuffer local_40;
  FILE *local_38;
  size_t local_30;
  undefined8 uStack_28;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  iVar1 = open_random(this,&local_60);
  local_38 = fdopen(iVar1,"w");
  local_40._vptr_BinaryBuffer = (_func_int **)&PTR__BinaryBuffer_001482f0;
  local_30 = 0;
  uStack_28 = 0;
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::operator()(save,x,&local_40);
  sz = local_30;
  fclose(local_38);
  fsync(iVar1);
  iVar1 = make_file_record(this,&local_60,sz);
  std::__cxx11::string::~string((string *)&local_60);
  return iVar1;
}

Assistant:

virtual int    put(const void* x, detail::Save save) override
      {
        std::string     filename;
        int fh = open_random(filename);
#if defined(_WIN32)
        detail::FileBuffer fb(_fdopen(fh, "wb"));
#else
        detail::FileBuffer fb(fdopen(fh, "w"));
#endif
        save(x, fb);
        size_t sz = fb.size();
        fclose(fb.file);
        io::utils::sync(fh);

        return make_file_record(filename, sz);
      }